

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O0

int thrd_join(thrd_t thr,int *res)

{
  int iVar1;
  undefined4 local_2c;
  undefined4 *puStack_28;
  int ires;
  void *pres;
  int *res_local;
  thrd_t thr_local;
  
  local_2c = 0;
  pres = res;
  res_local = (int *)thr;
  iVar1 = pthread_join(thr,&stack0xffffffffffffffd8);
  if (iVar1 == 0) {
    if (puStack_28 != (undefined4 *)0x0) {
      local_2c = *puStack_28;
      free(puStack_28);
    }
    if (pres != (void *)0x0) {
      *(undefined4 *)pres = local_2c;
    }
    thr_local._4_4_ = 1;
  }
  else {
    thr_local._4_4_ = 0;
  }
  return thr_local._4_4_;
}

Assistant:

int thrd_join(thrd_t thr, int *res)
{
#if defined(_TTHREAD_WIN32_)
  if (WaitForSingleObject(thr, INFINITE) == WAIT_FAILED)
  {
    return thrd_error;
  }
  if (res != NULL)
  {
    DWORD dwRes;
    GetExitCodeThread(thr, &dwRes);
    *res = dwRes;
  }
#elif defined(_TTHREAD_POSIX_)
  void *pres;
  int ires = 0;
  if (pthread_join(thr, &pres) != 0)
  {
    return thrd_error;
  }
  if (pres != NULL)
  {
    ires = *(int*)pres;
    free(pres);
  }
  if (res != NULL)
  {
    *res = ires;
  }
#endif
  return thrd_success;
}